

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SelectLeaf(Fts3Table *p,char *zTerm,int nTerm,char *zNode,int nNode,sqlite3_int64 *piLeaf,
                  sqlite3_int64 *piLeaf2)

{
  sqlite3_int64 local_60;
  int local_4c;
  char *pcStack_48;
  int nBlob;
  char *zBlob;
  int iHeight;
  int rc;
  sqlite3_int64 *piLeaf_local;
  char *pcStack_28;
  int nNode_local;
  char *zNode_local;
  char *pcStack_18;
  int nTerm_local;
  char *zTerm_local;
  Fts3Table *p_local;
  
  zBlob._4_4_ = 0;
  _iHeight = piLeaf;
  piLeaf_local._4_4_ = nNode;
  pcStack_28 = zNode;
  zNode_local._4_4_ = nTerm;
  pcStack_18 = zTerm;
  zTerm_local = (char *)p;
  if ((*zNode & 0x80U) == 0) {
    zBlob._0_4_ = (uint)(byte)*zNode;
  }
  else {
    sqlite3Fts3GetVarint32(zNode,(int *)&zBlob);
  }
  zBlob._4_4_ = fts3ScanInteriorNode
                          (pcStack_18,zNode_local._4_4_,pcStack_28,piLeaf_local._4_4_,_iHeight,
                           piLeaf2);
  if ((zBlob._4_4_ == 0) && (1 < (int)(uint)zBlob)) {
    pcStack_48 = (char *)0x0;
    local_4c = 0;
    if ((_iHeight != (long *)0x0) && ((piLeaf2 != (sqlite3_int64 *)0x0 && (*_iHeight != *piLeaf2))))
    {
      zBlob._4_4_ = sqlite3Fts3ReadBlock
                              ((Fts3Table *)zTerm_local,*_iHeight,&stack0xffffffffffffffb8,&local_4c
                               ,(int *)0x0);
      if (zBlob._4_4_ == 0) {
        zBlob._4_4_ = fts3SelectLeaf((Fts3Table *)zTerm_local,pcStack_18,zNode_local._4_4_,
                                     pcStack_48,local_4c,_iHeight,(sqlite3_int64 *)0x0);
      }
      sqlite3_free(pcStack_48);
      _iHeight = (long *)0x0;
    }
    pcStack_48 = (char *)0x0;
    if (zBlob._4_4_ == 0) {
      if (_iHeight == (long *)0x0) {
        local_60 = *piLeaf2;
      }
      else {
        local_60 = *_iHeight;
      }
      zBlob._4_4_ = sqlite3Fts3ReadBlock
                              ((Fts3Table *)zTerm_local,local_60,&stack0xffffffffffffffb8,&local_4c,
                               (int *)0x0);
    }
    if (zBlob._4_4_ == 0) {
      zBlob._4_4_ = fts3SelectLeaf((Fts3Table *)zTerm_local,pcStack_18,zNode_local._4_4_,pcStack_48,
                                   local_4c,_iHeight,piLeaf2);
    }
    sqlite3_free(pcStack_48);
  }
  return zBlob._4_4_;
}

Assistant:

static int fts3SelectLeaf(
  Fts3Table *p,                   /* Virtual table handle */
  const char *zTerm,              /* Term to select leaves for */
  int nTerm,                      /* Size of term zTerm in bytes */
  const char *zNode,              /* Buffer containing segment interior node */
  int nNode,                      /* Size of buffer at zNode */
  sqlite3_int64 *piLeaf,          /* Selected leaf node */
  sqlite3_int64 *piLeaf2          /* Selected leaf node */
){
  int rc = SQLITE_OK;             /* Return code */
  int iHeight;                    /* Height of this node in tree */

  assert( piLeaf || piLeaf2 );

  fts3GetVarint32(zNode, &iHeight);
  rc = fts3ScanInteriorNode(zTerm, nTerm, zNode, nNode, piLeaf, piLeaf2);
  assert( !piLeaf2 || !piLeaf || rc!=SQLITE_OK || (*piLeaf<=*piLeaf2) );

  if( rc==SQLITE_OK && iHeight>1 ){
    char *zBlob = 0;              /* Blob read from %_segments table */
    int nBlob = 0;                /* Size of zBlob in bytes */

    if( piLeaf && piLeaf2 && (*piLeaf!=*piLeaf2) ){
      rc = sqlite3Fts3ReadBlock(p, *piLeaf, &zBlob, &nBlob, 0);
      if( rc==SQLITE_OK ){
        rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, 0);
      }
      sqlite3_free(zBlob);
      piLeaf = 0;
      zBlob = 0;
    }

    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3ReadBlock(p, piLeaf?*piLeaf:*piLeaf2, &zBlob, &nBlob, 0);
    }
    if( rc==SQLITE_OK ){
      rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, piLeaf2);
    }
    sqlite3_free(zBlob);
  }

  return rc;
}